

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_progress.cpp
# Opt level: O1

void __thiscall libtorrent::aux::file_progress::clear(file_progress *this)

{
  pointer plVar1;
  
  this->m_total_on_disk = 0;
  plVar1 = (this->m_file_progress).super_vector<long,_std::allocator<long>_>.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_file_progress).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish !=
      plVar1) {
    (this->m_file_progress).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         plVar1;
  }
  if ((this->m_file_progress).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage !=
      (this->m_file_progress).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__shrink_to_fit_aux<std::vector<long,_std::allocator<long>_>,_true>::_S_do_it
              (&(this->m_file_progress).super_vector<long,_std::allocator<long>_>);
    return;
  }
  return;
}

Assistant:

void file_progress::clear()
	{
		INVARIANT_CHECK;
		m_total_on_disk = 0;
		m_file_progress.clear();
		m_file_progress.shrink_to_fit();
#if TORRENT_USE_INVARIANT_CHECKS
		m_have_pieces.clear();
#endif
	}